

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

bool __thiscall AddrInfo::IsTerrible(AddrInfo *this,NodeSeconds now)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  if ((long)now.__d.__r - (this->m_last_try).__d.__r < 0x3d) {
    bVar2 = false;
  }
  else {
    lVar1 = (this->super_CAddress).nTime.__d.__r;
    bVar2 = true;
    if ((long)now.__d.__r - lVar1 < 0x278d01 && lVar1 <= (long)now.__d.__r + 600) {
      lVar1 = (this->m_last_success).__d.__r;
      if (lVar1 != 0 || this->nAttempts < 3) {
        bVar2 = 9 < this->nAttempts && 0x93a80 < (long)now.__d.__r - lVar1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool AddrInfo::IsTerrible(NodeSeconds now) const
{
    if (now - m_last_try <= 1min) { // never remove things tried in the last minute
        return false;
    }

    if (nTime > now + 10min) { // came in a flying DeLorean
        return true;
    }

    if (now - nTime > ADDRMAN_HORIZON) { // not seen in recent history
        return true;
    }

    if (TicksSinceEpoch<std::chrono::seconds>(m_last_success) == 0 && nAttempts >= ADDRMAN_RETRIES) { // tried N times and never a success
        return true;
    }

    if (now - m_last_success > ADDRMAN_MIN_FAIL && nAttempts >= ADDRMAN_MAX_FAILURES) { // N successive failures in the last week
        return true;
    }

    return false;
}